

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O3

int http_OpenHttpGetEx(char *url_str,void **Handle,char **contentType,int *contentLength,
                      int *httpStatus,int lowRange,int highRange,int timeout)

{
  undefined4 extraout_EAX;
  int iVar1;
  uint uVar2;
  int iVar3;
  parse_status_t pVar4;
  SOCKINFO *info;
  http_header_t *phVar5;
  socklen_t addrlen;
  sockaddr_storage *parser;
  undefined1 auVar6 [16];
  int http_error_code;
  membuffer request;
  memptr ctype;
  uri_type url;
  SendInstruction rangeBuf;
  int local_304;
  membuffer local_300;
  memptr local_2e0;
  undefined1 local_2d0 [208];
  SendInstruction local_200;
  
  membuffer_init(&local_300);
  auVar6._0_4_ = -(uint)(url_str == (char *)0x0);
  auVar6._4_4_ = -(uint)(Handle == (void **)0x0);
  auVar6._8_4_ = -(uint)(contentType == (char **)0x0);
  auVar6._12_4_ = -(uint)(httpStatus == (int *)0x0);
  iVar1 = movmskps(extraout_EAX,auVar6);
  iVar3 = -0x65;
  if (iVar1 != 0) goto LAB_001198db;
  *httpStatus = 0;
  *Handle = (void *)0x0;
  *contentType = (char *)0x0;
  *contentLength = 0;
  iVar3 = -0x38f;
  if (highRange < lowRange) goto LAB_001198db;
  memset(&local_200,0,0x1d0);
  uVar2 = snprintf(local_200.RangeHeader,200,"Range: bytes=%d-%d\r\n",(ulong)(uint)lowRange,
                   (ulong)(uint)highRange);
  iVar3 = 0;
  if (199 < uVar2) goto LAB_001198db;
  membuffer_init(&local_300);
  iVar3 = MakeGetMessageEx(url_str,&local_300,(uri_type *)local_2d0,&local_200);
  if (iVar3 != 0) goto LAB_001198db;
  info = (SOCKINFO *)calloc(1,0x288);
  if (info == (SOCKINFO *)0x0) {
    iVar3 = -0x68;
    goto LAB_001198db;
  }
  parser = &info[1].foreign_sockaddr;
  parser_response_init((http_parser_t *)parser,HTTPMETHOD_GET);
  iVar1 = socket((uint)(ushort)local_2d0._80_2_,1,0);
  if (iVar1 != -1) {
    iVar1 = sock_init(info,iVar1);
    if (iVar1 == 0) {
      addrlen = 0x10;
      if (local_2d0._80_2_ == 10) {
        addrlen = 0x1c;
      }
      iVar1 = private_connect(info->socket,(sockaddr *)(local_2d0 + 0x50),addrlen);
      if (iVar1 == -1) {
        sock_destroy(info,2);
        free(info);
        iVar3 = -0xcc;
        goto LAB_001198db;
      }
      iVar3 = http_SendMessage(info,&timeout,"b",local_300.buf,local_300.length);
      if (iVar3 != 0) {
        sock_destroy(info,2);
        free(info);
        goto LAB_001198db;
      }
      iVar1 = ReadResponseLineAndHeaders(info,(http_parser_t *)parser,&timeout,&local_304);
      if (iVar1 == 4) {
        pVar4 = parser_get_entity_read_method((http_parser_t *)parser);
        if ((pVar4 == PARSE_SUCCESS) || (pVar4 == PARSE_CONTINUE_1)) {
          *httpStatus = *(int *)(info[2].foreign_sockaddr.__ss_padding + 0x52);
          phVar5 = httpmsg_find_hdr((http_message_t *)parser,4,&local_2e0);
          if (phVar5 != (http_header_t *)0x0) {
            phVar5 = (http_header_t *)local_2e0.buf;
          }
          *contentType = (char *)phVar5;
          iVar1 = 0;
          if (*(int *)(info[4].foreign_sockaddr.__ss_padding + 0x1e) == 4) {
LAB_001199ee:
            *contentLength = iVar1;
          }
          else {
            iVar1 = *(int *)(info[4].foreign_sockaddr.__ss_padding + 0x22);
            if (iVar1 == 4) {
              iVar1 = -4;
              goto LAB_001199ee;
            }
            if (iVar1 == 3) {
              iVar1 = -3;
              goto LAB_001199ee;
            }
            if (iVar1 == 2) {
              iVar1 = *(int *)(info[4].foreign_sockaddr.__ss_padding + 0x26);
              goto LAB_001199ee;
            }
          }
          *Handle = info;
          iVar3 = 0;
          goto LAB_001198db;
        }
      }
      free(info);
      iVar3 = -0x71;
      goto LAB_001198db;
    }
    sock_destroy(info,2);
  }
  free(info);
  iVar3 = -0xd0;
LAB_001198db:
  membuffer_destroy(&local_300);
  return iVar3;
}

Assistant:

int http_OpenHttpGetEx(const char *url_str,
	void **Handle,
	char **contentType,
	int *contentLength,
	int *httpStatus,
	int lowRange,
	int highRange,
	int timeout)
{
	int http_error_code;
	memptr ctype;
	SOCKET tcp_connection;
	size_t sockaddr_len;
	membuffer request;
	http_connection_handle_t *handle = NULL;
	uri_type url;
	parse_status_t status;
	int errCode = UPNP_E_SUCCESS;
	/* char rangeBuf[SIZE_RANGE_BUFFER]; */
	struct SendInstruction rangeBuf;
	int rc = 0;

	membuffer_init(&request);

	do {
		/* Checking Input parameters */
		if (!url_str || !Handle || !contentType || !httpStatus) {
			errCode = UPNP_E_INVALID_PARAM;
			break;
		}
		/* Initialize output parameters */
		*httpStatus = 0;
		*Handle = handle;
		*contentType = NULL;
		*contentLength = 0;
		if (lowRange > highRange) {
			errCode = UPNP_E_INTERNAL_ERROR;
			break;
		}
		memset(&rangeBuf, 0, sizeof(rangeBuf));
		rc = snprintf(rangeBuf.RangeHeader,
			sizeof(rangeBuf.RangeHeader),
			"Range: bytes=%d-%d\r\n",
			lowRange,
			highRange);
		if (rc < 0 || (unsigned int)rc >= sizeof(rangeBuf.RangeHeader))
			break;
		membuffer_init(&request);
		errCode = MakeGetMessageEx(url_str, &request, &url, &rangeBuf);
		if (errCode != UPNP_E_SUCCESS)
			break;
		handle = (http_connection_handle_t *)malloc(
			sizeof(http_connection_handle_t));
		if (!handle) {
			errCode = UPNP_E_OUTOF_MEMORY;
			break;
		}
		memset(handle, 0, sizeof(*handle));
		parser_response_init(&handle->response, HTTPMETHOD_GET);
		tcp_connection = socket(
			(int)url.hostport.IPaddress.ss_family, SOCK_STREAM, 0);
		if (tcp_connection == INVALID_SOCKET) {
			errCode = UPNP_E_SOCKET_ERROR;
			free(handle);
			break;
		}
		if (sock_init(&handle->sock_info, tcp_connection) !=
			UPNP_E_SUCCESS) {
			sock_destroy(&handle->sock_info, SD_BOTH);
			errCode = UPNP_E_SOCKET_ERROR;
			free(handle);
			break;
		}
		sockaddr_len = url.hostport.IPaddress.ss_family == AF_INET6
				       ? sizeof(struct sockaddr_in6)
				       : sizeof(struct sockaddr_in);
		errCode = private_connect(handle->sock_info.socket,
			(struct sockaddr *)&(url.hostport.IPaddress),
			(socklen_t)sockaddr_len);
		if (errCode == -1) {
			sock_destroy(&handle->sock_info, SD_BOTH);
			errCode = UPNP_E_SOCKET_CONNECT;
			free(handle);
			break;
		}
		/* send request */
		errCode = http_SendMessage(&handle->sock_info,
			&timeout,
			"b",
			request.buf,
			request.length);
		if (errCode != UPNP_E_SUCCESS) {
			sock_destroy(&handle->sock_info, SD_BOTH);
			free(handle);
			break;
		}
		if (ReadResponseLineAndHeaders(&handle->sock_info,
			    &handle->response,
			    &timeout,
			    &http_error_code) != (int)PARSE_OK) {
			errCode = UPNP_E_BAD_RESPONSE;
			free(handle);
			break;
		}
		status = parser_get_entity_read_method(&handle->response);
		if (status != (parse_status_t)PARSE_CONTINUE_1 &&
			status != (parse_status_t)PARSE_SUCCESS) {
			errCode = UPNP_E_BAD_RESPONSE;
			free(handle);
			break;
		}
		*httpStatus = handle->response.msg.status_code;
		errCode = UPNP_E_SUCCESS;

		if (!httpmsg_find_hdr(
			    &handle->response.msg, HDR_CONTENT_TYPE, &ctype))
			/* no content-type */
			*contentType = NULL;
		else
			*contentType = ctype.buf;
		if (handle->response.position == (parser_pos_t)POS_COMPLETE)
			*contentLength = 0;
		else if (handle->response.ent_position == ENTREAD_USING_CHUNKED)
			*contentLength = UPNP_USING_CHUNKED;
		else if (handle->response.ent_position == ENTREAD_USING_CLEN)
			*contentLength = (int)handle->response.content_length;
		else if (handle->response.ent_position == ENTREAD_UNTIL_CLOSE)
			*contentLength = UPNP_UNTIL_CLOSE;
		*Handle = handle;
	} while (0);

	membuffer_destroy(&request);

	return errCode;
}